

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

void phyr::coordinateSystem<double>(Vector3<double> *v1,Vector3<double> *v2,Vector3<double> *v3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_28;
  double dStack_20;
  double local_18;
  
  dVar3 = v1->x;
  dVar2 = v1->y;
  dVar1 = v1->z;
  if (ABS(dVar3) <= ABS(dVar2)) {
    dVar3 = 1.0 / SQRT(dVar2 * dVar2 + dVar1 * dVar1);
    dVar4 = dVar3 * 0.0;
    dVar5 = dVar3 * dVar1;
    dVar3 = dVar3 * -dVar2;
  }
  else {
    dVar5 = 1.0 / SQRT(dVar3 * dVar3 + dVar1 * dVar1);
    dVar3 = dVar3 * dVar5;
    dVar4 = -dVar1 * dVar5;
    dVar5 = dVar5 * 0.0;
  }
  v2->x = dVar4;
  v2->y = dVar5;
  v2->z = dVar3;
  cross<double>(v1,v2);
  v3->z = local_18;
  v3->x = local_28;
  v3->y = dStack_20;
  return;
}

Assistant:

inline void coordinateSystem(const Vector3<T>& v1, Vector3<T>* v2, Vector3<T>* v3) {
    ASSERT(v2 != nullptr && v3 != nullptr);
    if (std::abs(v1.x) > std::abs(v1.y))
        *v2 = Vector3<T>(-v1.z, 0, v1.x) / std::sqrt(v1.x * v1.x + v1.z * v1.z);
    else
        *v2 = Vector3<T>(0, v1.z, -v1.y) / std::sqrt(v1.y * v1.y + v1.z * v1.z);
    *v3 = cross(v1, *v2);
}